

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  lua_Debug ar;
  luaL_Buffer b;
  lua_Debug local_4d8;
  luaL_Buffer local_450;
  
  iVar2 = 1;
  iVar4 = 1;
  do {
    iVar5 = iVar2;
    iVar1 = lua_getstack(L1,iVar4,(lua_Debug *)&local_450);
    iVar2 = iVar4;
    iVar4 = iVar4 * 2;
  } while (iVar1 != 0);
  while (iVar4 = iVar2, iVar5 < iVar4) {
    iVar2 = (iVar5 + iVar4) / 2;
    iVar1 = lua_getstack(L1,iVar2,(lua_Debug *)&local_450);
    if (iVar1 != 0) {
      iVar5 = iVar2 + 1;
      iVar2 = iVar4;
    }
  }
  local_450.b = (char *)&local_450.init;
  local_450.n = 0;
  local_450.size = 0x400;
  local_450.L = L;
  lua_pushlightuserdata(L,&local_450);
  if (msg != (char *)0x0) {
    luaL_addstring(&local_450,msg);
    if (local_450.size <= local_450.n) {
      prepbuffsize(&local_450,1,-1);
    }
    local_450.b[local_450.n] = '\n';
    local_450.n = local_450.n + 1;
  }
  luaL_addstring(&local_450,"stack traceback:");
  iVar2 = lua_getstack(L1,level,&local_4d8);
  if (iVar2 != 0) {
    uVar6 = -(uint)(-0x17 < level - iVar4) | 10;
    do {
      bVar7 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar7) {
        lua_pushfstring(L,"\n\t...\t(skipping %d levels)",(ulong)(~level + (iVar4 - 0xbU)));
        luaL_addvalue(&local_450);
        level = iVar4 - 0xbU;
      }
      else {
        lua_getinfo(L1,"Slnt",&local_4d8);
        if (local_4d8.currentline < 1) {
          lua_pushfstring(L,"\n\t%s: in ",local_4d8.short_src);
        }
        else {
          lua_pushfstring(L,"\n\t%s:%d: in ",local_4d8.short_src);
        }
        luaL_addvalue(&local_450);
        iVar2 = pushglobalfuncname(L,&local_4d8);
        if (iVar2 == 0) {
          if (*local_4d8.namewhat == '\0') {
            if (*local_4d8.what == 'C') {
              pcVar3 = "?";
            }
            else {
              if (*local_4d8.what != 'm') {
                lua_pushfstring(L,"function <%s:%d>",local_4d8.short_src,
                                (ulong)(uint)local_4d8.linedefined);
                goto LAB_00106b05;
              }
              pcVar3 = "main chunk";
            }
            lua_pushstring(L,pcVar3);
          }
          else {
            lua_pushfstring(L,"%s \'%s\'",local_4d8.namewhat,local_4d8.name);
          }
        }
        else {
          pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
          lua_pushfstring(L,"function \'%s\'",pcVar3);
          lua_rotate(L,-2,-1);
          lua_settop(L,-2);
        }
LAB_00106b05:
        level = level + 1;
        luaL_addvalue(&local_450);
        if (local_4d8.istailcall != '\0') {
          luaL_addstring(&local_450,"\n\t(...tail calls...)");
        }
      }
      iVar2 = lua_getstack(L1,level,&local_4d8);
    } while (iVar2 != 0);
  }
  luaL_pushresult(&local_450);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  luaL_Buffer b;
  lua_Debug ar;
  int last = lastlevel(L1);
  int limit2show = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  luaL_buffinit(L, &b);
  if (msg) {
    luaL_addstring(&b, msg);
    luaL_addchar(&b, '\n');
  }
  luaL_addstring(&b, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (limit2show-- == 0) {  /* too many levels? */
      int n = last - level - LEVELS2 + 1;  /* number of levels to skip */
      lua_pushfstring(L, "\n\t...\t(skipping %d levels)", n);
      luaL_addvalue(&b);  /* add warning about skip */
      level += n;  /* and skip to last levels */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      if (ar.currentline <= 0)
        lua_pushfstring(L, "\n\t%s: in ", ar.short_src);
      else
        lua_pushfstring(L, "\n\t%s:%d: in ", ar.short_src, ar.currentline);
      luaL_addvalue(&b);
      pushfuncname(L, &ar);
      luaL_addvalue(&b);
      if (ar.istailcall)
        luaL_addstring(&b, "\n\t(...tail calls...)");
    }
  }
  luaL_pushresult(&b);
}